

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_proto3_unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto3_unittest::TestProto3BytesMap::_InternalSerialize
          (TestProto3BytesMap *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_3
  *paVar1;
  MapField<proto3_unittest::TestProto3BytesMap_MapStringEntry_DoNotUse,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)9>
  *this_00;
  int *key;
  ulong uVar2;
  NodeBase *pNVar3;
  char *in_R9;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range3;
  long lVar4;
  UntypedMapBase *pUVar5;
  string_view field_name;
  string_view field_name_00;
  const_iterator __begin3;
  
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
            ((MapFieldBase *)&(this->field_0)._impl_);
  if (*(int *)((long)&this->field_0 + 0x10) != 0) {
    paVar1 = &(this->field_0)._impl_.map_bytes_.
              super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0;
    google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
              ((MapFieldBase *)&(this->field_0)._impl_);
    if ((stream->is_serialization_deterministic_ == true) &&
       (1 < (paVar1->map_).super_KeyMapBase<unsigned_int>.super_UntypedMapBase.num_elements_)) {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::MapSorterFlat((MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__begin3,&paVar1->map_);
      pUVar5 = __begin3.super_UntypedMapIterator.m_;
      for (lVar4 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar4 != 0;
          lVar4 = lVar4 + -0x10) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
                 ::InternalSerialize(1,*(int **)&pUVar5->index_of_first_non_null_,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(*(int **)&pUVar5->index_of_first_non_null_ + 2),target,
                                     stream);
        pUVar5 = (UntypedMapBase *)&pUVar5->table_;
      }
      std::
      unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
    else {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)&paVar1->map_);
      while (__begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
                 ::InternalSerialize(1,(int *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(__begin3.super_UntypedMapIterator.node_ + 2),target,stream)
        ;
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
  }
  this_00 = &(this->field_0)._impl_.map_string_;
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_00);
  if (*(int *)((long)&this->field_0 + 0x40) != 0) {
    paVar1 = &(this->field_0)._impl_.map_string_.
              super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0;
    google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_00);
    if ((stream->is_serialization_deterministic_ == true) &&
       (1 < (paVar1->map_).super_KeyMapBase<unsigned_int>.super_UntypedMapBase.num_elements_)) {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::MapSorterFlat((MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__begin3,&paVar1->map_);
      for (lVar4 = (long)__begin3.super_UntypedMapIterator.node_ << 4; lVar4 != 0;
          lVar4 = lVar4 + -0x10) {
        key = *(int **)&(__begin3.super_UntypedMapIterator.m_)->index_of_first_non_null_;
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                 ::InternalSerialize(2,key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(key + 2),target,stream);
        field_name._M_str = in_R9;
        field_name._M_len = (size_t)"proto3_unittest.TestProto3BytesMap.map_string";
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  (*(WireFormatLite **)(key + 2),(char *)(ulong)(uint)key[4],1,0x2d,field_name);
        __begin3.super_UntypedMapIterator.m_ =
             (UntypedMapBase *)&(__begin3.super_UntypedMapIterator.m_)->table_;
      }
      std::
      unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
      ::~unique_ptr((unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
                     *)&__begin3.super_UntypedMapIterator.m_);
    }
    else {
      google::protobuf::internal::UntypedMapBase::begin
                (&__begin3.super_UntypedMapIterator,(UntypedMapBase *)&paVar1->map_);
      while (pNVar3 = __begin3.super_UntypedMapIterator.node_,
            __begin3.super_UntypedMapIterator.node_ != (NodeBase *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                 ::InternalSerialize(2,(int *)(__begin3.super_UntypedMapIterator.node_ + 1),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(__begin3.super_UntypedMapIterator.node_ + 2),target,stream)
        ;
        field_name_00._M_str = in_R9;
        field_name_00._M_len = (size_t)"proto3_unittest.TestProto3BytesMap.map_string";
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  ((WireFormatLite *)pNVar3[2].next,(char *)(ulong)*(uint *)&pNVar3[3].next,1,0x2d,
                   field_name_00);
        google::protobuf::internal::UntypedMapIterator::PlusPlus(&__begin3.super_UntypedMapIterator)
        ;
      }
    }
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    target = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestProto3BytesMap::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestProto3BytesMap& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto3_unittest.TestProto3BytesMap)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // map<int32, bytes> map_bytes = 1;
  if (!this_._internal_map_bytes().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, std::string>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, std::string,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_BYTES>;
    const auto& field = this_._internal_map_bytes();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, string> map_string = 2;
  if (!this_._internal_map_string().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, std::string>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, std::string,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_STRING>;
    const auto& field = this_._internal_map_string();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            2, entry.first, entry.second, target, stream);
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            entry.second.data(), static_cast<int>(entry.second.length()),
 ::google::protobuf::internal::WireFormatLite::SERIALIZE, "proto3_unittest.TestProto3BytesMap.map_string");
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            2, entry.first, entry.second, target, stream);
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            entry.second.data(), static_cast<int>(entry.second.length()),
 ::google::protobuf::internal::WireFormatLite::SERIALIZE, "proto3_unittest.TestProto3BytesMap.map_string");
      }
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto3_unittest.TestProto3BytesMap)
  return target;
}